

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O2

SnifferResult * __thiscall
duckdb::CSVSniffer::SniffCSV
          (SnifferResult *__return_storage_ptr__,CSVSniffer *this,bool force_match)

{
  shared_ptr<duckdb::CSVBufferManager,_true> *this_00;
  vector<duckdb::LogicalType,_true> *this_01;
  CSVReaderOptions *pCVar1;
  vector<duckdb::LogicalType,_true> *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_02;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *__x;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  CSVBufferManager *pCVar6;
  pointer pCVar7;
  pointer pSVar8;
  CSVErrorHandler *pCVar9;
  string *msg;
  ulong uVar10;
  const_reference pvVar11;
  reference pvVar12;
  long lVar13;
  const_reference pvVar14;
  reference pvVar15;
  InvalidInputException *pIVar16;
  vector<duckdb::LogicalType,_true> *pvVar17;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_03;
  ulong uVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  reference rVar19;
  string type_error;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  pointer local_60 [3];
  pointer local_48 [3];
  
  this_00 = &this->buffer_manager;
  pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar6->sniffing = true;
  DetectDialect(this);
  pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar7 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
           operator->(&pCVar6->file_handle);
  if (pCVar7->compression_type != UNCOMPRESSED) {
    pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
    bVar4 = CSVBufferManager::IsBlockUnloaded(pCVar6,0);
    if (bVar4) {
      pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
      CSVBufferManager::ResetBufferManager(pCVar6);
    }
  }
  DetectTypes(this);
  RefineTypes(this);
  DetectHeader(this);
  ReplaceTypes(this);
  pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar7 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
           operator->(&pCVar6->file_handle);
  if (pCVar7->compression_type != UNCOMPRESSED) {
    pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
    CSVBufferManager::ResetBufferManager(pCVar6);
  }
  pCVar6 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
  pCVar6->sniffing = false;
  pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
           ::operator->(&this->best_candidate);
  pCVar9 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                     (&(pSVar8->super_BaseScanner).error_handler);
  bVar4 = CSVErrorHandler::AnyErrors(pCVar9);
  if ((bVar4) && ((this->options->ignore_errors).value == false)) {
    pSVar8 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
             ::operator->(&this->best_candidate);
    pCVar9 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                       (&(pSVar8->super_BaseScanner).error_handler);
    CSVErrorHandler::ErrorIfTypeExists(pCVar9,MAXIMUM_LINE_SIZE);
  }
  SetResultOptions(this);
  pCVar1 = this->options;
  pCVar1->auto_detect = true;
  msg = &pCVar1->sniffer_user_mismatch_error;
  pvVar2 = (this->set_columns).types;
  if ((pvVar2 != (vector<duckdb::LogicalType,_true> *)0x0) &&
     ((pvVar2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pvVar2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    if ((pCVar1->dialect_options).header.value == true) {
      ::std::__cxx11::string::string
                ((string *)&type_error,
                 "The Column names set by the user do not match the ones found by the sniffer. \n",
                 (allocator *)&local_100);
      this_02 = (this->set_columns).names;
      if ((long)(this_02->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this_02->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
          (long)(this->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
        bVar4 = true;
        uVar18 = 0;
        while( true ) {
          pvVar2 = (this->set_columns).types;
          if (pvVar2 == (vector<duckdb::LogicalType,_true> *)0x0) {
            uVar10 = 0;
          }
          else {
            uVar10 = ((long)(pvVar2->
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                            .
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar2->
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x18;
          }
          if (uVar10 <= uVar18) break;
          pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(this_02,uVar18);
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(&this->names,uVar18);
          bVar5 = ::std::operator!=(pvVar11,pvVar12);
          if (bVar5) {
            ::std::__cxx11::to_string(&local_c0,uVar18);
            ::std::operator+(&local_e0,"Column at position: ",&local_c0);
            ::std::operator+(&local_180,&local_e0,", Set name: ");
            pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::get<true>(this_02,uVar18);
            ::std::operator+(&local_140,&local_180,pvVar11);
            ::std::operator+(&local_160,&local_140,", Sniffed Name: ");
            pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::get<true>(&this->names,uVar18);
            ::std::operator+(&local_120,&local_160,pvVar12);
            ::std::operator+(&local_100,&local_120,anon_var_dwarf_4bacf03 + 8);
            ::std::__cxx11::string::append((string *)&type_error);
            ::std::__cxx11::string::~string((string *)&local_100);
            ::std::__cxx11::string::~string((string *)&local_120);
            ::std::__cxx11::string::~string((string *)&local_160);
            ::std::__cxx11::string::~string((string *)&local_140);
            ::std::__cxx11::string::~string((string *)&local_180);
            ::std::__cxx11::string::~string((string *)&local_e0);
            ::std::__cxx11::string::~string((string *)&local_c0);
            bVar4 = false;
          }
          uVar18 = uVar18 + 1;
        }
        if (!bVar4) {
          ::std::__cxx11::string::append((string *)msg);
        }
      }
      ::std::__cxx11::string::~string((string *)&type_error);
    }
    ::std::__cxx11::string::string
              ((string *)&type_error,
               "The Column types set by the user do not match the ones found by the sniffer. \n",
               (allocator *)&local_100);
    pvVar2 = (this->set_columns).types;
    if (pvVar2 == (vector<duckdb::LogicalType,_true> *)0x0) {
      lVar13 = 0;
    }
    else {
      lVar13 = ((long)(pvVar2->
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar2->
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18;
    }
    if (((long)(this->detected_types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
        (long)(this->detected_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 == lVar13) {
      this_01 = &this->detected_types;
      bVar4 = true;
      uVar18 = 0;
      pvVar17 = pvVar2;
      while( true ) {
        if (pvVar17 == (vector<duckdb::LogicalType,_true> *)0x0) {
          uVar10 = 0;
        }
        else {
          uVar10 = ((long)(pvVar17->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar17->
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18;
        }
        if (uVar10 <= uVar18) break;
        pvVar14 = vector<duckdb::LogicalType,_true>::get<true>(pvVar2,uVar18);
        pvVar15 = vector<duckdb::LogicalType,_true>::get<true>(this_01,uVar18);
        bVar5 = LogicalType::operator!=(pvVar14,pvVar15);
        if (bVar5) {
          ::std::__cxx11::to_string(&local_c0,uVar18);
          ::std::operator+(&local_e0,"Column at position: ",&local_c0);
          ::std::operator+(&local_180,&local_e0," Set type: ");
          pvVar14 = vector<duckdb::LogicalType,_true>::get<true>(pvVar2,uVar18);
          LogicalType::ToString_abi_cxx11_(&local_80,pvVar14);
          ::std::operator+(&local_140,&local_180,&local_80);
          ::std::operator+(&local_160,&local_140," Sniffed type: ");
          pvVar15 = vector<duckdb::LogicalType,_true>::get<true>(this_01,uVar18);
          LogicalType::ToString_abi_cxx11_(&local_a0,pvVar15);
          ::std::operator+(&local_120,&local_160,&local_a0);
          ::std::operator+(&local_100,&local_120,anon_var_dwarf_4bacf03 + 8);
          ::std::__cxx11::string::append((string *)&type_error);
          ::std::__cxx11::string::~string((string *)&local_100);
          ::std::__cxx11::string::~string((string *)&local_120);
          ::std::__cxx11::string::~string((string *)&local_a0);
          ::std::__cxx11::string::~string((string *)&local_160);
          ::std::__cxx11::string::~string((string *)&local_140);
          ::std::__cxx11::string::~string((string *)&local_80);
          ::std::__cxx11::string::~string((string *)&local_180);
          ::std::__cxx11::string::~string((string *)&local_e0);
          ::std::__cxx11::string::~string((string *)&local_c0);
          pvVar14 = vector<duckdb::LogicalType,_true>::get<true>(pvVar2,uVar18);
          pvVar15 = vector<duckdb::LogicalType,_true>::get<true>(this_01,uVar18);
          LogicalType::operator=(pvVar15,pvVar14);
          rVar19 = vector<bool,_true>::get<true>(&this->manually_set,uVar18);
          *rVar19._M_p = *rVar19._M_p | rVar19._M_mask;
          bVar4 = false;
        }
        uVar18 = uVar18 + 1;
        pvVar17 = (this->set_columns).types;
      }
      if (!bVar4) {
        ::std::__cxx11::string::append((string *)msg);
      }
    }
    if (force_match && (pCVar1->sniffer_user_mismatch_error)._M_string_length != 0) {
      pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      InvalidInputException::InvalidInputException(pIVar16,msg);
      __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)&this->options->was_type_manually_set,
               &(this->manually_set).super_vector<bool,_std::allocator<bool>_>);
    ::std::__cxx11::string::~string((string *)&type_error);
  }
  if (!force_match || (pCVar1->sniffer_user_mismatch_error)._M_string_length == 0) {
    ::std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)&this->options->was_type_manually_set,
               &(this->manually_set).super_vector<bool,_std::allocator<bool>_>);
    __x = &((this->set_columns).types)->
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
    if ((__x == (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x0) ||
       ((__x->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl
        .super__Vector_impl_data._M_start ==
        (__x->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)._M_impl
        .super__Vector_impl_data._M_finish)) {
      this_03 = &local_1b8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (this_03,&(this->detected_types).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_04,&(this->names).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      (__return_storage_ptr__->return_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_1b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->return_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->return_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48[0] = local_60[0];
    }
    else {
      this_03 = &local_198;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector(this_03,__x);
      this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_04,&((this->set_columns).names)->
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      (__return_storage_ptr__->return_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->return_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->return_types).
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_48[0];
    pbVar3 = *(pointer *)(this_04 + 0x10);
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(this_04 + 8);
    (__return_storage_ptr__->names).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar3;
    *(undefined8 *)this_04 = 0;
    *(undefined8 *)(this_04 + 8) = 0;
    *(undefined8 *)(this_04 + 0x10) = 0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_04);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(this_03);
    return __return_storage_ptr__;
  }
  pIVar16 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(pIVar16,msg);
  __cxa_throw(pIVar16,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SnifferResult CSVSniffer::SniffCSV(const bool force_match) {
	buffer_manager->sniffing = true;
	// 1. Dialect Detection
	DetectDialect();
	if (buffer_manager->file_handle->compression_type != FileCompressionType::UNCOMPRESSED &&
	    buffer_manager->IsBlockUnloaded(0)) {
		buffer_manager->ResetBufferManager();
	}
	// 2. Type Detection
	DetectTypes();
	// 3. Type Refinement
	RefineTypes();
	// 4. Header Detection
	DetectHeader();
	// 5. Type Replacement
	ReplaceTypes();

	// We reset the buffer for compressed files
	// This is done because we can't easily seek on compressed files, if a buffer goes out of scope we must read from
	// the start
	if (buffer_manager->file_handle->compression_type != FileCompressionType::UNCOMPRESSED) {
		buffer_manager->ResetBufferManager();
	}
	buffer_manager->sniffing = false;
	if (best_candidate->error_handler->AnyErrors() && !options.ignore_errors.GetValue()) {
		best_candidate->error_handler->ErrorIfTypeExists(MAXIMUM_LINE_SIZE);
	}
	D_ASSERT(best_sql_types_candidates_per_column_idx.size() == names.size());
	// We are done, Set the CSV Options in the reference. Construct and return the result.
	SetResultOptions();
	options.auto_detect = true;
	// Check if everything matches
	auto &error = options.sniffer_user_mismatch_error;
	if (set_columns.IsSet()) {
		bool match = true;
		// Columns and their types were set, let's validate they match
		if (options.dialect_options.header.GetValue()) {
			// If the header exists it should match
			string header_error = "The Column names set by the user do not match the ones found by the sniffer. \n";
			auto &set_names = *set_columns.names;
			if (set_names.size() == names.size()) {
				for (idx_t i = 0; i < set_columns.Size(); i++) {
					if (set_names[i] != names[i]) {
						header_error += "Column at position: " + to_string(i) + ", Set name: " + set_names[i] +
						                ", Sniffed Name: " + names[i] + "\n";
						match = false;
					}
				}
			}

			if (!match) {
				error += header_error;
			}
		}
		match = true;
		string type_error = "The Column types set by the user do not match the ones found by the sniffer. \n";
		auto &set_types = *set_columns.types;
		if (detected_types.size() == set_columns.Size()) {
			for (idx_t i = 0; i < set_columns.Size(); i++) {
				if (set_types[i] != detected_types[i]) {
					type_error += "Column at position: " + to_string(i) + " Set type: " + set_types[i].ToString() +
					              " Sniffed type: " + detected_types[i].ToString() + "\n";
					detected_types[i] = set_types[i];
					manually_set[i] = true;
					match = false;
				}
			}
		}

		if (!match) {
			error += type_error;
		}

		if (!error.empty() && force_match) {
			throw InvalidInputException(error);
		}
		options.was_type_manually_set = manually_set;
	}
	if (!error.empty() && force_match) {
		throw InvalidInputException(error);
	}
	options.was_type_manually_set = manually_set;
	if (set_columns.IsSet()) {
		return SnifferResult(*set_columns.types, *set_columns.names);
	}
	return SnifferResult(detected_types, names);
}